

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O0

void ReplaceObject(void)

{
  Location LVar1;
  undefined1 local_20 [8];
  Location location;
  RecyclerTestObject *object;
  
  location._8_8_ = CreateNewObject();
  LVar1 = GetRandomLocation();
  local_20 = (undefined1  [8])LVar1.location;
  location.location._0_4_ = LVar1.type;
  Location::Set((Location *)local_20,(RecyclerTestObject *)location._8_8_);
  return;
}

Assistant:

void ReplaceObject()
{
    // Create a new object
    RecyclerTestObject * object = CreateNewObject();
    
    // Walk to a random location in the current object graph
    Location location = GetRandomLocation();

    // Set the new object there unconditionally
    location.Set(object);
}